

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O1

dynamic_string * __thiscall
crnlib::dynamic_string::set(dynamic_string *this,dynamic_string *other,uint max_len)

{
  char *__src;
  uint uVar1;
  
  if (this == other) {
    if (max_len < this->m_len) {
      this->m_pStr[max_len] = '\0';
      this->m_len = (uint16)max_len;
    }
  }
  else {
    uVar1 = (uint)other->m_len;
    if (max_len < other->m_len) {
      uVar1 = max_len;
    }
    if (uVar1 == 0) {
      clear(this);
    }
    else {
      if ((uVar1 != 0xffff) && (this->m_buf_size <= uVar1)) {
        expand_buf(this,uVar1 + 1,false);
      }
      if (uVar1 < this->m_buf_size) {
        this->m_len = (uint16)uVar1;
        __src = "";
        if (other->m_pStr != (char *)0x0) {
          __src = other->m_pStr;
        }
        memcpy(this->m_pStr,__src,(ulong)uVar1);
        this->m_pStr[uVar1] = '\0';
      }
    }
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::set(const dynamic_string& other, uint max_len)
    {
        if (this == &other)
        {
            if (max_len < m_len)
            {
                m_pStr[max_len] = '\0';
                m_len = static_cast<uint16>(max_len);
            }
        }
        else
        {
            const uint len = math::minimum<uint>(max_len, other.m_len);

            if (!len)
            {
                clear();
            }
            else if (ensure_buf(len, false))
            {
                m_len = static_cast<uint16>(len);
                memcpy(m_pStr, other.get_ptr_priv(), m_len);
                m_pStr[len] = '\0';
            }
        }

        check();

        return *this;
    }